

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void sprite(dw_rom *rom,char *sprite_name)

{
  char *__s1;
  long lVar1;
  byte bVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  undefined8 *apuStack_40 [2];
  
  if (sprite_count_i == 0) {
    sprite_count_i = 1;
  }
  bVar2 = sprite_count_i;
  lVar1 = -((ulong)sprite_count_i - 1 & 0xfffffffffffffff0 | 0x2b0);
  apuStack_40[1] = (undefined8 *)((long)apuStack_40 + lVar1 + 8);
  if ((rom->flags[9] & 0xc) != 0) {
    return;
  }
  *apuStack_40[1] = gwaelin;
  *(code **)(&stack0xffffffffffffffd0 + lVar1) = slime;
  *(code **)(&stack0xffffffffffffffd8 + lVar1) = red_slime;
  *(code **)(&stack0xffffffffffffffe0 + lVar1) = metal_slime;
  *(code **)(&stack0xffffffffffffffe8 + lVar1) = dragonlord;
  *(code **)(&stack0xfffffffffffffff0 + lVar1) = dw2_cannock;
  *(code **)(&stack0xfffffffffffffff8 + lVar1) = dw2_midenhall;
  *(code **)(&stack0x00000000 + lVar1) = dw2_moonbrooke;
  *(code **)(&stack0x00000008 + lVar1) = dw3_female_fighter;
  *(code **)(&stack0x00000010 + lVar1) = dw3_male_fighter;
  *(code **)(&stack0x00000018 + lVar1) = dw3_female_goof_off;
  *(code **)(&stack0x00000020 + lVar1) = dw3_male_goof_off;
  *(code **)(&stack0x00000028 + lVar1) = dw3_ghost;
  *(code **)(&stack0x00000030 + lVar1) = dw3_hero;
  *(code **)(&stack0x00000038 + lVar1) = dw3_female_merchant;
  *(code **)(&stack0x00000040 + lVar1) = dw3_male_merchant;
  *(code **)(&stack0x00000048 + lVar1) = dw3_female_pilgrim;
  *(code **)(&stack0x00000050 + lVar1) = dw3_male_pilgrim;
  *(code **)(&stack0x00000058 + lVar1) = dw3_female_sage;
  *(code **)(&stack0x00000060 + lVar1) = dw3_male_sage;
  *(code **)(&stack0x00000068 + lVar1) = dw3_female_soldier;
  *(code **)(&stack0x00000070 + lVar1) = dw3_male_soldier;
  *(code **)(&stack0x00000078 + lVar1) = dw3_female_wizard;
  *(code **)(&stack0x00000080 + lVar1) = dw3_male_wizard;
  *(code **)(&stack0x00000088 + lVar1) = dw4_alena;
  *(code **)(&stack0x00000090 + lVar1) = dw4_brey;
  *(code **)(&stack0x00000098 + lVar1) = dw4_celia;
  *(code **)(&stack0x000000a0 + lVar1) = dw4_cristo;
  *(code **)(&stack0x000000a8 + lVar1) = doran;
  *(code **)(&stack0x000000b0 + lVar1) = dw4_healie;
  *(code **)(&stack0x000000b8 + lVar1) = dw4_heroine;
  *(code **)(&stack0x000000c0 + lVar1) = dw4_hero;
  *(code **)(&stack0x000000c8 + lVar1) = dw4_mara;
  *(code **)(&stack0x000000d0 + lVar1) = dw4_nara;
  *(code **)(&stack0x000000d8 + lVar1) = dw4_ragnar;
  *(code **)(&stack0x000000e0 + lVar1) = dw4_taloon;
  *(code **)(&stack0x000000e8 + lVar1) = dw4_tov_the_dog;
  *(code **)(&stack0x000000f0 + lVar1) = dw4_yeti;
  *(code **)(&stack0x000000f8 + lVar1) = ff_black_belt;
  *(code **)(&stack0x00000100 + lVar1) = ff_black_mage;
  *(code **)(&stack0x00000108 + lVar1) = ff_black_wizard;
  *(code **)(&stack0x00000110 + lVar1) = ff_fighter;
  *(code **)(&stack0x00000118 + lVar1) = ff_knight;
  *(code **)(&stack0x00000120 + lVar1) = ff_master;
  *(code **)(&stack0x00000128 + lVar1) = ff_ninja;
  *(code **)(&stack0x00000130 + lVar1) = ff_red_mage;
  *(code **)(&stack0x00000138 + lVar1) = ff_red_wizard;
  *(code **)(&stack0x00000140 + lVar1) = ff_thief;
  *(code **)(&stack0x00000148 + lVar1) = ff_white_mage;
  *(code **)(&stack0x00000150 + lVar1) = ff_white_wizard;
  *(code **)(&stack0x00000158 + lVar1) = ff4_cecil;
  *(code **)(&stack0x00000160 + lVar1) = ff4_edge;
  *(code **)(&stack0x00000168 + lVar1) = link;
  *(code **)(&stack0x00000170 + lVar1) = mario;
  *(code **)(&stack0x00000178 + lVar1) = luigi;
  *(code **)(&stack0x00000180 + lVar1) = yoshi;
  *(code **)(&stack0x00000188 + lVar1) = wario;
  *(code **)(&stack0x00000190 + lVar1) = waluigi;
  *(code **)(&stack0x00000198 + lVar1) = pacman;
  *(code **)(&stack0x000001a0 + lVar1) = ms_pacman;
  *(code **)(&stack0x000001a8 + lVar1) = inky;
  *(code **)(&stack0x000001b0 + lVar1) = blinky;
  *(code **)(&stack0x000001b8 + lVar1) = pinky;
  *(code **)(&stack0x000001c0 + lVar1) = clyde;
  *(code **)(&stack0x000001c8 + lVar1) = sue;
  *(code **)(&stack0x000001d0 + lVar1) = blaster_master;
  *(code **)(&stack0x000001d8 + lVar1) = bomberman;
  *(code **)(&stack0x000001e0 + lVar1) = christine;
  *(code **)(&stack0x000001e8 + lVar1) = kirby;
  *(code **)(&stack0x000001f0 + lVar1) = lala;
  *(code **)(&stack0x000001f8 + lVar1) = lolo;
  *(code **)(&stack0x00000200 + lVar1) = st_mike;
  *(code **)(&stack0x00000208 + lVar1) = mina_the_hollower;
  *(code **)(&stack0x00000210 + lVar1) = plumplim;
  *(code **)(&stack0x00000218 + lVar1) = guanyu;
  *(code **)(&stack0x00000220 + lVar1) = zhangfei;
  *(code **)(&stack0x00000228 + lVar1) = zhaoyun;
  *(code **)(&stack0x00000230 + lVar1) = huangzhong;
  *(code **)(&stack0x00000238 + lVar1) = machao;
  *(code **)(&stack0x00000240 + lVar1) = zhugeliang;
  *(code **)(&stack0x00000248 + lVar1) = jiangwei;
  *(code **)(&stack0x00000250 + lVar1) = lubu;
  *(code **)(&stack0x00000258 + lVar1) = bo_jackson;
  *(code **)(&stack0x00000260 + lVar1) = jerry_rice;
  *(code **)(&stack0x00000268 + lVar1) = barry_sanders;
  *(undefined8 *)((long)apuStack_40 + lVar1) = 0x102a65;
  iVar3 = strcmp("Random",sprite_name);
  if (iVar3 == 0) {
    if (bVar2 == 0) {
      sprite_count_i = 1;
    }
    *(undefined8 *)((long)apuStack_40 + lVar1) = 0x102add;
    uVar4 = mt_rand(2,(ulong)sprite_count_i - 1 | 0x56);
    sprite_name = dwr_sprite_names[uVar4];
  }
  else {
    uVar5 = 0x57;
    if (sprite_count_i == 0) {
      uVar5 = 0;
    }
    uVar4 = 2;
    while( true ) {
      if (uVar5 == 0) {
        sprite_count_i = 1;
        uVar5 = 0x57;
      }
      if (uVar5 <= uVar4) {
        return;
      }
      __s1 = dwr_sprite_names[uVar4];
      *(undefined8 *)((long)apuStack_40 + lVar1) = 0x102ab0;
      iVar3 = strcmp(__s1,sprite_name);
      if (iVar3 == 0) break;
      uVar4 = uVar4 + 1;
    }
  }
  *(undefined8 *)((long)apuStack_40 + lVar1) = 0x102afc;
  printf("Setting player sprite to %s...\n",sprite_name);
  (*(code *)apuStack_40[1][uVar4 - 2])(rom);
  return;
}

Assistant:

void sprite(dw_rom *rom, const char *sprite_name)
{
    void (*sprite_func[sprite_count()-2])(dw_rom *rom);
    size_t i=0;

    if (INVISIBLE_HERO(rom)) {
        return;
    }

    sprite_func[i++] = &gwaelin;
    sprite_func[i++] = &slime;
    sprite_func[i++] = &red_slime;
    sprite_func[i++] = &metal_slime;
    sprite_func[i++] = &dragonlord;

    sprite_func[i++] = &dw2_cannock;
    sprite_func[i++] = &dw2_midenhall;
    sprite_func[i++] = &dw2_moonbrooke;

    sprite_func[i++] = &dw3_female_fighter;
    sprite_func[i++] = &dw3_male_fighter;

    sprite_func[i++] = &dw3_female_goof_off;
    sprite_func[i++] = &dw3_male_goof_off;
    sprite_func[i++] = &dw3_ghost;
    sprite_func[i++] = &dw3_hero;
    sprite_func[i++] = &dw3_female_merchant;
    sprite_func[i++] = &dw3_male_merchant;
    sprite_func[i++] = &dw3_female_pilgrim;
    sprite_func[i++] = &dw3_male_pilgrim;
    sprite_func[i++] = &dw3_female_sage;
    sprite_func[i++] = &dw3_male_sage;
    sprite_func[i++] = &dw3_female_soldier;
    sprite_func[i++] = &dw3_male_soldier;
    sprite_func[i++] = &dw3_female_wizard;
    sprite_func[i++] = &dw3_male_wizard;

    sprite_func[i++] = &dw4_alena;
    sprite_func[i++] = &dw4_brey;
    sprite_func[i++] = &dw4_celia;
    sprite_func[i++] = &dw4_cristo;
    sprite_func[i++] = &doran;
    sprite_func[i++] = &dw4_healie;
    sprite_func[i++] = &dw4_heroine;
    sprite_func[i++] = &dw4_hero;
    sprite_func[i++] = &dw4_mara;
    sprite_func[i++] = &dw4_nara;
    sprite_func[i++] = &dw4_ragnar;
    sprite_func[i++] = &dw4_taloon;
    sprite_func[i++] = &dw4_tov_the_dog;
    sprite_func[i++] = &dw4_yeti;

    sprite_func[i++] = &ff_black_belt;
    sprite_func[i++] = &ff_black_mage;
    sprite_func[i++] = &ff_black_wizard;
    sprite_func[i++] = &ff_fighter;
    sprite_func[i++] = &ff_knight;
    sprite_func[i++] = &ff_master;
    sprite_func[i++] = &ff_ninja;
    sprite_func[i++] = &ff_red_mage;
    sprite_func[i++] = &ff_red_wizard;
    sprite_func[i++] = &ff_thief;
    sprite_func[i++] = &ff_white_mage;
    sprite_func[i++] = &ff_white_wizard;
    sprite_func[i++] = &ff4_cecil;
    sprite_func[i++] = &ff4_edge;

    sprite_func[i++] = &link;
    sprite_func[i++] = &mario;
    sprite_func[i++] = &luigi;
    sprite_func[i++] = &yoshi;
    sprite_func[i++] = &wario;
    sprite_func[i++] = &waluigi;

    sprite_func[i++] = &pacman;
    sprite_func[i++] = &ms_pacman;
    sprite_func[i++] = &inky;
    sprite_func[i++] = &blinky;
    sprite_func[i++] = &pinky;
    sprite_func[i++] = &clyde;
    sprite_func[i++] = &sue;

    sprite_func[i++] = &blaster_master;
    sprite_func[i++] = &bomberman;
    sprite_func[i++] = &christine;
    sprite_func[i++] = &kirby;
    sprite_func[i++] = &lala;
    sprite_func[i++] = &lolo;
    sprite_func[i++] = &st_mike;

    sprite_func[i++] = &mina_the_hollower;

    sprite_func[i++] = &plumplim;

    sprite_func[i++] = &guanyu;
    sprite_func[i++] = &zhangfei;
    sprite_func[i++] = &zhaoyun;
    sprite_func[i++] = &huangzhong;
    sprite_func[i++] = &machao;
    sprite_func[i++] = &zhugeliang;
    sprite_func[i++] = &jiangwei;
    sprite_func[i++] = &lubu;

    sprite_func[i++] = &bo_jackson;
    sprite_func[i++] = &jerry_rice;
    sprite_func[i++] = &barry_sanders;

    if (!strcmp("Random", sprite_name)) {

        i = mt_rand(2, sprite_count()-1);
        printf("Setting player sprite to %s...\n", dwr_sprite_names[i]);
        (*sprite_func[i-2])(rom);
    } else {
        for (i=2; i < sprite_count(); i++) {
            if (!strcmp(dwr_sprite_names[i], sprite_name)) {
                printf("Setting player sprite to %s...\n", sprite_name);
                (*sprite_func[i-2])(rom);
                break;
            }
        }
    }
}